

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::~IfcFooting(IfcFooting *this)

{
  *(undefined8 *)&this[-1].field_0x48 = 0x8be850;
  *(undefined8 *)&this->field_0x30 = 0x8be968;
  *(undefined8 *)&this[-1].field_0xd0 = 0x8be878;
  *(undefined8 *)&this[-1].field_0xe0 = 0x8be8a0;
  *(undefined8 *)&this[-1].field_0x118 = 0x8be8c8;
  this[-1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8be8f0;
  *(undefined8 *)&this[-1].field_0x180 = 0x8be918;
  *(undefined8 *)this = 0x8be940;
  if (*(undefined1 **)&this->field_0x10 != &this->field_0x20) {
    operator_delete(*(undefined1 **)&this->field_0x10);
  }
  IfcElement::~IfcElement((IfcElement *)&this[-1].field_0x48,&PTR_construction_vtable_24__008be988);
  operator_delete(&this[-1].field_0x48);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}